

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_counts(void)

{
  bitset_t *bitset;
  size_t sVar1;
  int k;
  bitset_t *b2;
  bitset_t *b1;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  bitset_create();
  bitset = bitset_create();
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    bitset_set(bitset,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    bitset_set(bitset,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  }
  sVar1 = bitset_intersection_count(b1,b2);
  if (sVar1 != 0x14e) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_counts",0x99);
    exit(1);
  }
  sVar1 = bitset_union_count(b1,b2);
  if (sVar1 != 0x682) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_counts",0x9a);
    exit(1);
  }
  bitset_free((bitset_t *)0x101e58);
  bitset_free((bitset_t *)0x101e62);
  return;
}

Assistant:

void test_counts() {
  bitset_t *b1 = bitset_create();
  bitset_t *b2 = bitset_create();

  for (int k = 0; k < 1000; ++k) {
    bitset_set(b1, 2 * k);
    bitset_set(b2, 3 * k);
  }
  TEST_ASSERT(bitset_intersection_count(b1, b2) == 334);
  TEST_ASSERT(bitset_union_count(b1, b2) == 1666);
  bitset_free(b1);
  bitset_free(b2);
}